

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

char * skill_level_name(xchar skill_level)

{
  char *local_18;
  char *ptr;
  xchar skill_level_local;
  
  switch(skill_level) {
  case '\x01':
    local_18 = "Unskilled";
    break;
  case '\x02':
    local_18 = "Basic";
    break;
  case '\x03':
    local_18 = "Skilled";
    break;
  case '\x04':
    local_18 = "Expert";
    break;
  case '\x05':
    local_18 = "Master";
    break;
  case '\x06':
    local_18 = "Grand Master";
    break;
  default:
    local_18 = "Unknown";
  }
  return local_18;
}

Assistant:

static const char *skill_level_name(xchar skill_level)
{
    const char *ptr;

    switch (skill_level) {
	case P_UNSKILLED:    ptr = "Unskilled"; break;
	case P_BASIC:	     ptr = "Basic";     break;
	case P_SKILLED:	     ptr = "Skilled";   break;
	case P_EXPERT:	     ptr = "Expert";    break;
	/* these are for unarmed combat/martial arts only */
	case P_MASTER:	     ptr = "Master";    break;
	case P_GRAND_MASTER: ptr = "Grand Master"; break;
	default:	     ptr = "Unknown";	break;
    }

    return ptr;
}